

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateDSTests.cpp
# Opt level: O0

int __thiscall
vkt::DynamicState::DynamicStateDSTests::init(DynamicStateDSTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  int extraout_EAX;
  mapped_type *ppcVar2;
  InstanceFactory<vkt::DynamicState::(anonymous_namespace)::DepthBoundsParamTestInstance> *this_00;
  StencilParamsBasicTestCase *pSVar3;
  InstanceFactory<vkt::DynamicState::(anonymous_namespace)::StencilParamsAdvancedTestInstance>
  *this_01;
  map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  local_180;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  Vector<float,_4> local_fc;
  Vector<float,_4> local_ec;
  undefined1 local_d9;
  map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  local_d8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  key_type local_58 [5];
  key_type local_44;
  undefined1 local_40 [8];
  ShaderMap shaderPaths;
  DynamicStateDSTests *this_local;
  
  shaderPaths._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::
  map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::map((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
         *)local_40);
  local_44 = SHADERTYPE_VERTEX;
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)local_40,&local_44);
  *ppcVar2 = "vulkan/dynamic_state/VertexFetch.vert";
  local_58[0] = SHADERTYPE_FRAGMENT;
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)local_40,local_58);
  *ppcVar2 = "vulkan/dynamic_state/VertexFetch.frag";
  this_00 = (InstanceFactory<vkt::DynamicState::(anonymous_namespace)::DepthBoundsParamTestInstance>
             *)operator_new(0xa0);
  local_d9 = 1;
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"depth_bounds",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"Perform depth bounds test",&local_a1);
  std::
  map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::map(&local_d8,
        (map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
         *)local_40);
  InstanceFactory<vkt::DynamicState::(anonymous_namespace)::DepthBoundsParamTestInstance>::
  InstanceFactory(this_00,pTVar1,&local_78,&local_a0,&local_d8);
  local_d9 = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  std::
  map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~map(&local_d8);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  pSVar3 = (StencilParamsBasicTestCase *)operator_new(0x90);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  tcu::Vector<float,_4>::Vector(&local_ec,0.0,0.0,1.0,1.0);
  DynamicState::anon_unknown_0::StencilParamsBasicTestCase::StencilParamsBasicTestCase
            (pSVar3,pTVar1,"stencil_params_basic_1","Perform basic stencil test 1",0xd,6,5,&local_ec
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  pSVar3 = (StencilParamsBasicTestCase *)operator_new(0x90);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  tcu::Vector<float,_4>::Vector(&local_fc,0.0,1.0,0.0,1.0);
  DynamicState::anon_unknown_0::StencilParamsBasicTestCase::StencilParamsBasicTestCase
            (pSVar3,pTVar1,"stencil_params_basic_2","Perform basic stencil test 2",6,2,5,&local_fc);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  this_01 = (InstanceFactory<vkt::DynamicState::(anonymous_namespace)::StencilParamsAdvancedTestInstance>
             *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"stencil_params_advanced",&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"Perform advanced stencil test",&local_149);
  std::
  map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::map(&local_180,
        (map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
         *)local_40);
  InstanceFactory<vkt::DynamicState::(anonymous_namespace)::StencilParamsAdvancedTestInstance>::
  InstanceFactory(this_01,pTVar1,&local_120,&local_148,&local_180);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  std::
  map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~map(&local_180);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  std::
  map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~map((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
          *)local_40);
  return extraout_EAX;
}

Assistant:

void DynamicStateDSTests::init (void)
{
	ShaderMap shaderPaths;
	shaderPaths[glu::SHADERTYPE_VERTEX] = "vulkan/dynamic_state/VertexFetch.vert";
	shaderPaths[glu::SHADERTYPE_FRAGMENT] = "vulkan/dynamic_state/VertexFetch.frag";

	addChild(new InstanceFactory<DepthBoundsParamTestInstance>(m_testCtx, "depth_bounds", "Perform depth bounds test", shaderPaths));
	addChild(new StencilParamsBasicTestCase(m_testCtx, "stencil_params_basic_1", "Perform basic stencil test 1", 0x0D, 0x06, 0x05, tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f)));
	addChild(new StencilParamsBasicTestCase(m_testCtx, "stencil_params_basic_2", "Perform basic stencil test 2", 0x06, 0x02, 0x05, tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f)));
	addChild(new InstanceFactory<StencilParamsAdvancedTestInstance>(m_testCtx, "stencil_params_advanced", "Perform advanced stencil test", shaderPaths));
}